

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_tool.h
# Opt level: O0

String * __thiscall
Json::codePointToUTF8_abi_cxx11_(String *__return_storage_ptr__,Json *this,uint cp)

{
  byte *pbVar1;
  uint uVar2;
  undefined1 local_14;
  uint cp_local;
  String *result;
  
  uVar2 = (uint)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_14 = (byte)this;
  if (uVar2 < 0x80) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pbVar1 = local_14;
  }
  else if (uVar2 < 0x800) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pbVar1 = local_14 & 0x3f | 0x80;
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pbVar1 = (byte)(uVar2 >> 6) & 0x1f | 0xc0;
  }
  else if (uVar2 < 0x10000) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pbVar1 = local_14 & 0x3f | 0x80;
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pbVar1 = (byte)(uVar2 >> 6) & 0x3f | 0x80;
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pbVar1 = (byte)(uVar2 >> 0xc) & 0xf | 0xe0;
  }
  else if (uVar2 < 0x110000) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pbVar1 = local_14 & 0x3f | 0x80;
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pbVar1 = (byte)(uVar2 >> 6) & 0x3f | 0x80;
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pbVar1 = (byte)(uVar2 >> 0xc) & 0x3f | 0x80;
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pbVar1 = (byte)(uVar2 >> 0x12) & 7 | 0xf0;
  }
  return __return_storage_ptr__;
}

Assistant:

static inline String codePointToUTF8(unsigned int cp) {
  String result;

  // based on description from http://en.wikipedia.org/wiki/UTF-8

  if (cp <= 0x7f) {
    result.resize(1);
    result[0] = static_cast<char>(cp);
  } else if (cp <= 0x7FF) {
    result.resize(2);
    result[1] = static_cast<char>(0x80 | (0x3f & cp));
    result[0] = static_cast<char>(0xC0 | (0x1f & (cp >> 6)));
  } else if (cp <= 0xFFFF) {
    result.resize(3);
    result[2] = static_cast<char>(0x80 | (0x3f & cp));
    result[1] = static_cast<char>(0x80 | (0x3f & (cp >> 6)));
    result[0] = static_cast<char>(0xE0 | (0xf & (cp >> 12)));
  } else if (cp <= 0x10FFFF) {
    result.resize(4);
    result[3] = static_cast<char>(0x80 | (0x3f & cp));
    result[2] = static_cast<char>(0x80 | (0x3f & (cp >> 6)));
    result[1] = static_cast<char>(0x80 | (0x3f & (cp >> 12)));
    result[0] = static_cast<char>(0xF0 | (0x7 & (cp >> 18)));
  }

  return result;
}